

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blitter.cpp
# Opt level: O0

void __thiscall Amiga::Blitter<true>::set_control(Blitter<true> *this,int index,uint16_t value)

{
  int iVar1;
  uint32_t uVar2;
  bool local_39;
  LogLine local_20;
  uint16_t local_16;
  uint local_14;
  uint16_t value_local;
  Blitter<true> *pBStack_10;
  int index_local;
  Blitter<true> *this_local;
  
  local_16 = value;
  local_14 = index;
  pBStack_10 = this;
  if (index == 0) {
    this->minterms_ = (uint8_t)value;
    BlitterSequencer::set_control(&this->sequencer_,(int)(uint)value >> 8);
  }
  else {
    this->line_mode_ = (value & 1) != 0;
    this->one_dot_ = (value & 2) != 0;
    this->line_direction_ = (int)(uint)value >> 2 & 7;
    iVar1 = 1;
    if ((value & 0x40) != 0) {
      iVar1 = -1;
    }
    this->line_sign_ = iVar1;
    uVar2 = 1;
    if ((this->one_dot_ & 1U) != 0) {
      uVar2 = 0xffffffff;
    }
    this->direction_ = uVar2;
    this->exclusive_fill_ = (value & 0x10) != 0;
    local_39 = (this->exclusive_fill_ & 1U) == 0 && (value & 8) != 0;
    this->inclusive_fill_ = local_39;
    this->fill_carry_ = (value & 4) != 0;
  }
  this->shifts_[(int)local_14] = (uint)(local_16 >> 0xc);
  Log::Logger<(Log::Source)6>::info((Logger<(Log::Source)6> *)&local_20);
  Log::Logger<(Log::Source)6>::LogLine::append
            (&local_20,"Set control %d to %04x",(ulong)local_14,(ulong)local_16);
  Log::Logger<(Log::Source)6>::LogLine::~LogLine(&local_20);
  return;
}

Assistant:

void Blitter<record_bus>::set_control(int index, uint16_t value) {
	if(index) {
		line_mode_ = (value & 0x0001);
		one_dot_ = value & 0x0002;
		line_direction_ = (value >> 2) & 7;
		line_sign_ = (value & 0x0040) ? -1 : 1;

		direction_ = one_dot_ ? uint32_t(-1) : uint32_t(1);
		exclusive_fill_ = (value & 0x0010);
		inclusive_fill_ = !exclusive_fill_ && (value & 0x0008);	// Exclusive fill takes precedence. Probably? TODO: verify.
		fill_carry_ = (value & 0x0004);
	} else {
		minterms_ = value & 0xff;
		sequencer_.set_control(value >> 8);
	}
	shifts_[index] = value >> 12;
	logger.info().append("Set control %d to %04x", index, value);
}